

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_run_end(ConsoleReporter *this,TestRunStats *p)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  uint uVar4;
  bool bVar5;
  char *pcVar6;
  int iVar7;
  Enum code;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if ((this->opt->minimal == true) && (p->numTestCasesFailed == 0)) {
    return;
  }
  poVar3 = this->s;
  Color::operator<<(poVar3,Yellow);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "===============================================================================\n",
             0x50);
  poVar3 = this->s;
  *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
  uVar4 = p->numAsserts;
  if ((uint)p->numAsserts < p->numTestCasesPassingFilters) {
    uVar4 = p->numTestCasesPassingFilters;
  }
  dVar8 = log10((double)(uVar4 + 1));
  dVar8 = ceil(dVar8);
  uVar2 = p->numTestCasesPassingFilters - p->numTestCasesFailed;
  uVar4 = p->numAsserts - p->numAssertsFailed;
  if (uVar4 < uVar2) {
    uVar4 = uVar2;
  }
  dVar9 = log10((double)(uVar4 + 1));
  dVar9 = ceil(dVar9);
  uVar4 = p->numAssertsFailed;
  if ((uint)p->numAssertsFailed < p->numTestCasesFailed) {
    uVar4 = p->numTestCasesFailed;
  }
  dVar10 = log10((double)(uVar4 + 1));
  dVar10 = ceil(dVar10);
  bVar5 = p->numAssertsFailed < 1 && p->numTestCasesFailed == 0;
  poVar3 = this->s;
  Color::operator<<(poVar3,Cyan);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
  Color::operator<<(poVar3,None);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"test cases: ",0xc);
  *(long *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = (long)(int)dVar8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
  bVar1 = p->numTestCasesPassingFilters != 0 && bVar5;
  Color::operator<<(poVar3,(uint)bVar1 + (uint)bVar1 * 2);
  *(long *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = (long)(int)dVar9;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," passed",7);
  Color::operator<<(poVar3,None);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
  Color::operator<<(poVar3,(uint)(p->numTestCasesFailed != 0) * 2);
  *(long *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = (long)(int)dVar10;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
  Color::operator<<(poVar3,None);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," |",2);
  if (this->opt->no_skipped_summary == false) {
    poVar3 = this->s;
    iVar7 = p->numTestCases - p->numTestCasesPassingFilters;
    code = Yellow;
    if (iVar7 == 0) {
      code = None;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    Color::operator<<(poVar3,code);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," skipped",8);
    Color::operator<<(poVar3,None);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->s,"\n",1);
  poVar3 = this->s;
  Color::operator<<(poVar3,Cyan);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
  Color::operator<<(poVar3,None);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"assertions: ",0xc);
  *(long *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = (long)(int)dVar8;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,p->numAsserts);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
  bVar5 = p->numAsserts != 0 && bVar5;
  Color::operator<<(poVar3,(uint)bVar5 + (uint)bVar5 * 2);
  *(long *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = (long)(int)dVar9;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,p->numAsserts - p->numAssertsFailed);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," passed",7);
  Color::operator<<(poVar3,None);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
  Color::operator<<(poVar3,(uint)(0 < p->numAssertsFailed) * 2);
  *(long *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = (long)(int)dVar10;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,p->numAssertsFailed);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
  Color::operator<<(poVar3,None);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," |\n",3);
  poVar3 = this->s;
  Color::operator<<(poVar3,Cyan);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[doctest] ",10);
  Color::operator<<(poVar3,None);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Status: ",8);
  Color::operator<<(poVar3,(p->numTestCasesFailed == 0) + Red);
  pcVar6 = "FAILURE!";
  if (p->numTestCasesFailed == 0) {
    pcVar6 = "SUCCESS!";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,8);
  Color::operator<<(poVar3,None);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            if(opt.minimal && p.numTestCasesFailed == 0)
                return;

            separator_to_stream();
            s << std::dec;

            auto totwidth = int(std::ceil(log10((std::max(p.numTestCasesPassingFilters, static_cast<unsigned>(p.numAsserts))) + 1)));
            auto passwidth = int(std::ceil(log10((std::max(p.numTestCasesPassingFilters - p.numTestCasesFailed, static_cast<unsigned>(p.numAsserts - p.numAssertsFailed))) + 1)));
            auto failwidth = int(std::ceil(log10((std::max(p.numTestCasesFailed, static_cast<unsigned>(p.numAssertsFailed))) + 1)));
            const bool anythingFailed = p.numTestCasesFailed > 0 || p.numAssertsFailed > 0;
            s << Color::Cyan << "[doctest] " << Color::None << "test cases: " << std::setw(totwidth)
              << p.numTestCasesPassingFilters << " | "
              << ((p.numTestCasesPassingFilters == 0 || anythingFailed) ? Color::None :
                                                                          Color::Green)
              << std::setw(passwidth) << p.numTestCasesPassingFilters - p.numTestCasesFailed << " passed"
              << Color::None << " | " << (p.numTestCasesFailed > 0 ? Color::Red : Color::None)
              << std::setw(failwidth) << p.numTestCasesFailed << " failed" << Color::None << " |";
            if(opt.no_skipped_summary == false) {
                const int numSkipped = p.numTestCases - p.numTestCasesPassingFilters;
                s << " " << (numSkipped == 0 ? Color::None : Color::Yellow) << numSkipped
                  << " skipped" << Color::None;
            }
            s << "\n";
            s << Color::Cyan << "[doctest] " << Color::None << "assertions: " << std::setw(totwidth)
              << p.numAsserts << " | "
              << ((p.numAsserts == 0 || anythingFailed) ? Color::None : Color::Green)
              << std::setw(passwidth) << (p.numAsserts - p.numAssertsFailed) << " passed" << Color::None
              << " | " << (p.numAssertsFailed > 0 ? Color::Red : Color::None) << std::setw(failwidth)
              << p.numAssertsFailed << " failed" << Color::None << " |\n";
            s << Color::Cyan << "[doctest] " << Color::None
              << "Status: " << (p.numTestCasesFailed > 0 ? Color::Red : Color::Green)
              << ((p.numTestCasesFailed > 0) ? "FAILURE!" : "SUCCESS!") << Color::None << std::endl;
        }